

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_PushErrorCode(char *function,GPU_ErrorEnum error,char *details,...)

{
  GPU_ErrorObject *pGVar1;
  GPU_ErrorObject *pGVar2;
  char in_AL;
  undefined8 in_RCX;
  char *pcVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar5;
  ulong uVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list lst;
  char buf [512];
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 local_2e8 [24];
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  char local_238 [8];
  undefined1 *local_230;
  undefined1 *local_228;
  
  if (in_AL != '\0') {
    local_2b8 = in_XMM0_Qa;
    local_2a8 = in_XMM1_Qa;
    local_298 = in_XMM2_Qa;
    local_288 = in_XMM3_Qa;
    local_278 = in_XMM4_Qa;
    local_268 = in_XMM5_Qa;
    local_258 = in_XMM6_Qa;
    local_248 = in_XMM7_Qa;
  }
  local_2d0 = in_RCX;
  local_2c8 = in_R8;
  local_2c0 = in_R9;
  gpu_init_error_queue();
  if (_gpu_debug_level != GPU_DEBUG_LEVEL_0) {
    if (details == (char *)0x0) {
      pcVar4 = "NULL";
      if (function != (char *)0x0) {
        pcVar4 = function;
      }
      if (error < (GPU_ERROR_FILE_NOT_FOUND|GPU_ERROR_BACKEND_ERROR)) {
        pcVar3 = (&PTR_anon_var_dwarf_2fefb_001ddbc8)[error];
      }
      else {
        pcVar3 = "UNKNOWN ERROR";
      }
      GPU_LogError("%s: %s\n",pcVar4,pcVar3);
    }
    else {
      local_2f8 = local_2e8;
      local_300 = &stack0x00000008;
      local_308 = 0x3000000018;
      vsnprintf(local_238,0x200,details,&local_308);
      pcVar4 = "NULL";
      if (function != (char *)0x0) {
        pcVar4 = function;
      }
      if (error < (GPU_ERROR_FILE_NOT_FOUND|GPU_ERROR_BACKEND_ERROR)) {
        pcVar3 = (&PTR_anon_var_dwarf_2fefb_001ddbc8)[error];
      }
      else {
        pcVar3 = "UNKNOWN ERROR";
      }
      GPU_LogError("%s: %s - %s\n",pcVar4,pcVar3,local_238);
    }
  }
  uVar5 = _gpu_num_error_codes;
  pGVar2 = _gpu_error_code_queue;
  uVar6 = (ulong)_gpu_num_error_codes;
  if (_gpu_num_error_codes < _gpu_error_code_queue_size) {
    pcVar4 = _gpu_error_code_queue[uVar6].function;
    if (function != (char *)0x0) {
      pGVar1 = _gpu_error_code_queue + uVar6;
      strncpy(pcVar4,function,0x80);
      pcVar4 = pGVar1->function + 0x80;
    }
    *pcVar4 = '\0';
    pGVar2[uVar6].error = error;
    if (details == (char *)0x0) {
      *pGVar2[uVar6].details = '\0';
    }
    else {
      local_228 = local_2e8;
      local_230 = &stack0x00000008;
      local_238[0] = '\x18';
      local_238[1] = '\0';
      local_238[2] = '\0';
      local_238[3] = '\0';
      local_238[4] = '0';
      local_238[5] = '\0';
      local_238[6] = '\0';
      local_238[7] = '\0';
      vsnprintf(pGVar2[uVar6].details,0x200,details,local_238);
      uVar5 = _gpu_num_error_codes;
    }
    _gpu_num_error_codes = uVar5 + 1;
  }
  return;
}

Assistant:

void GPU_PushErrorCode(const char* function, GPU_ErrorEnum error, const char* details, ...)
{
    gpu_init_error_queue();

    if(GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_1)
    {
        // Print the message
        if(details != NULL)
        {
            char buf[GPU_ERROR_DETAILS_STRING_MAX];
            va_list lst;
            va_start(lst, details);
            vsnprintf(buf, GPU_ERROR_DETAILS_STRING_MAX, details, lst);
            va_end(lst);

            GPU_LogError("%s: %s - %s\n", (function == NULL? "NULL" : function), GPU_GetErrorString(error), buf);
        }
        else
            GPU_LogError("%s: %s\n", (function == NULL? "NULL" : function), GPU_GetErrorString(error));
    }

    if(_gpu_num_error_codes < _gpu_error_code_queue_size)
    {
        if(function == NULL)
            _gpu_error_code_queue[_gpu_num_error_codes].function[0] = '\0';
        else
        {
            strncpy(_gpu_error_code_queue[_gpu_num_error_codes].function, function, GPU_ERROR_FUNCTION_STRING_MAX);
            _gpu_error_code_queue[_gpu_num_error_codes].function[GPU_ERROR_FUNCTION_STRING_MAX] = '\0';
        }
        _gpu_error_code_queue[_gpu_num_error_codes].error = error;
        if(details == NULL)
            _gpu_error_code_queue[_gpu_num_error_codes].details[0] = '\0';
        else
        {
            va_list lst;
            va_start(lst, details);
            vsnprintf(_gpu_error_code_queue[_gpu_num_error_codes].details, GPU_ERROR_DETAILS_STRING_MAX, details, lst);
            va_end(lst);
        }
        _gpu_num_error_codes++;
    }
}